

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestQueue.cpp
# Opt level: O1

void anon_unknown.dwarf_1e3e31::writeq(QueueWriter *w,size_t size)

{
  char *pcVar1;
  size_t sVar2;
  Result *in_R9;
  ExpressionDecomposer local_44;
  ulong local_40;
  Result local_38;
  
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_44,DT_REQUIRE);
  local_40 = 1;
  if ((ulong)((long)w->_writeEnd - (long)w->_writePos) < size) {
    sVar2 = binlog::detail::QueueWriter::maximizeWriteCapacity(w);
    local_40 = (ulong)(size <= sVar2);
  }
  local_40 = (ulong)local_44.m_at << 0x20 | local_40;
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_38,(Expression_lhs *)&local_40);
  doctest::detail::decomp_assert
            ((detail *)0xc,0x1bd840,(char *)0x11,0x1bda0d,&local_38.m_passed,in_R9);
  doctest::String::~String(&local_38.m_decomp);
  memset(w->_writePos,0,size);
  pcVar1 = w->_writePos;
  w->_writePos = pcVar1 + size;
  (w->_queue->writeIndex).super___atomic_base<unsigned_long>._M_i =
       (long)(pcVar1 + size) - (long)w->_queue->buffer;
  return;
}

Assistant:

void writeq(binlog::detail::QueueWriter& w, std::size_t size)
{
  REQUIRE(w.beginWrite(size));

  std::unique_ptr<char[]> buf(new char[size]());
  w.writeBuffer(buf.get(), size);
  w.endWrite();
}